

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thanm.c
# Opt level: O1

char * anm_get_name(anm_archive_t *archive,char *name)

{
  int iVar1;
  char *pcVar2;
  list_node_t *plVar3;
  
  plVar3 = (list_node_t *)&archive->names;
  do {
    plVar3 = plVar3->next;
    if (plVar3 == (list_node_t *)0x0) {
      pcVar2 = strdup(name);
      list_append_new(&archive->names,pcVar2);
      return pcVar2;
    }
    pcVar2 = (char *)plVar3->data;
    iVar1 = strcmp(name,pcVar2);
  } while (iVar1 != 0);
  return pcVar2;
}

Assistant:

static char*
anm_get_name(
    anm_archive_t* archive,
    const char* name)
{
    char* other_name;
    list_for_each(&archive->names, other_name) {
        if (strcmp(name, other_name) == 0)
            return other_name;
    }

    other_name = strdup(name);
    list_append_new(&archive->names, other_name);
    return other_name;
}